

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  Entry **this;
  code *pcVar1;
  JavascriptPromiseResolveOrRejectFunction *pJVar2;
  JavascriptPromise *pJVar3;
  JavascriptPromise *pJVar4;
  bool bVar5;
  bool bVar6;
  int n;
  CallFlags CVar7;
  BOOL BVar8;
  ScriptContext *pSVar9;
  ThreadContext *pTVar10;
  Var *values;
  undefined4 *puVar11;
  JavascriptLibrary *this_00;
  Var instance;
  Var pvVar12;
  RecyclableObject *pRVar13;
  DynamicObject *intrinsicProto;
  JavascriptMethod p_Var14;
  JavascriptException *err;
  CallInfo local_f0;
  undefined1 local_e8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  JavascriptExceptionObject *exception;
  JavascriptPromiseResolveOrRejectFunction *reject;
  JavascriptPromiseResolveOrRejectFunction *resolve;
  JavascriptPromise *promise;
  RecyclableObject *executor;
  RecyclableObject *local_a0;
  undefined1 local_98 [8];
  AutoTagNativeLibraryEntry __tag;
  bool isCtorSuperCall;
  Var newTarget;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar9 = RecyclableObject::GetScriptContext(function);
  pTVar10 = ScriptContext::GetThreadContext(pSVar9);
  pSVar9 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar10,0xc00,pSVar9,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar5 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x19,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1a,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pSVar9 = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetLibrary(pSVar9);
  instance = Arguments::GetNewTarget((Arguments *)&scriptContext);
  this = &__tag.entry.next;
  Arguments::Arguments((Arguments *)this,(Arguments *)&scriptContext);
  bVar5 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)this);
  local_a0 = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_98,function,(CallInfo)function_local,L"Promise",
             &stack0x00000000);
  CVar7 = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  if ((CVar7 == CallFlags_New) &&
     ((instance == (Var)0x0 || (BVar8 = Js::JavascriptOperators::IsUndefined(instance), BVar8 == 0))
     )) {
    if (1 < ((uint)scriptContext & 0xffffff)) {
      pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,1);
      bVar6 = JavascriptConversion::IsCallable(pvVar12);
      if (bVar6) {
        pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,1);
        promise = (JavascriptPromise *)VarTo<Js::RecyclableObject>(pvVar12);
        resolve = (JavascriptPromiseResolveOrRejectFunction *)
                  JavascriptLibrary::CreatePromise(this_00);
        if (bVar5) {
          pRVar13 = VarTo<Js::RecyclableObject>(instance);
          pJVar2 = resolve;
          intrinsicProto =
               JavascriptLibraryBase::GetPromisePrototype(&this_00->super_JavascriptLibraryBase);
          Js::JavascriptOperators::OrdinaryCreateFromConstructor
                    (pRVar13,(RecyclableObject *)pJVar2,intrinsicProto,pSVar9);
        }
        InitializePromise((JavascriptPromise *)resolve,&reject,
                          (JavascriptPromiseResolveOrRejectFunction **)&exception,pSVar9);
        autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
        autoReentrancyHandler._9_7_ = 0;
        pTVar10 = ScriptContext::GetThreadContext(pSVar9);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_e8,pTVar10);
        pTVar10 = ScriptContext::GetThreadContext(pSVar9);
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar10);
        pTVar10 = ScriptContext::GetThreadContext(pSVar9);
        ThreadContext::AssertJsReentrancy(pTVar10);
        pJVar3 = promise;
        p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)promise);
        CheckIsExecutable((RecyclableObject *)pJVar3,p_Var14);
        p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)promise);
        pJVar3 = promise;
        CallInfo::CallInfo(&local_f0,CallFlags_Value,3);
        pJVar4 = promise;
        CallInfo::CallInfo((CallInfo *)&err,CallFlags_Value,3);
        pRVar13 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
        (*p_Var14)((RecyclableObject *)pJVar3,(CallInfo)pJVar4,local_f0,0,0,0,0,err,pRVar13,reject,
                   exception);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_e8);
        if (autoReentrancyHandler._8_8_ != 0) {
          TryRejectWithExceptionObject
                    ((JavascriptExceptionObject *)autoReentrancyHandler._8_8_,exception,pSVar9);
        }
        pJVar2 = resolve;
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_98)
        ;
        return pJVar2;
      }
    }
    JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ec34,L"Promise");
  }
  JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ea00,L"Promise");
}

Assistant:

Var JavascriptPromise::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Promise, scriptContext);

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise"));

        // 1. If NewTarget is undefined, throw a TypeError exception.
        if ((callInfo.Flags & CallFlags_New) != CallFlags_New || (newTarget != nullptr && JavascriptOperators::IsUndefined(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("Promise"));
        }

        // 2. If IsCallable(executor) is false, throw a TypeError exception.
        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise"));
        }
        RecyclableObject* executor = VarTo<RecyclableObject>(args[1]);

        // 3. Let promise be ? OrdinaryCreateFromConstructor(NewTarget, "%PromisePrototype%", <<[[PromiseState]], [[PromiseResult]], [[PromiseFulfillReactions]], [[PromiseRejectReactions]], [[PromiseIsHandled]] >>).
        JavascriptPromise* promise = library->CreatePromise();
        if (isCtorSuperCall)
        {
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), promise, library->GetPromisePrototype(), scriptContext);
        }

        JavascriptPromiseResolveOrRejectFunction* resolve;
        JavascriptPromiseResolveOrRejectFunction* reject;

        // 4. Set promise's [[PromiseState]] internal slot to "pending".
        // 5. Set promise's [[PromiseFulfillReactions]] internal slot to a new empty List.
        // 6. Set promise's [[PromiseRejectReactions]] internal slot to a new empty List.
        // 7. Set promise's [[PromiseIsHandled]] internal slot to false.
        // 8. Let resolvingFunctions be CreateResolvingFunctions(promise).
        InitializePromise(promise, &resolve, &reject, scriptContext);

        JavascriptExceptionObject* exception = nullptr;

        // 9. Let completion be Call(executor, undefined, << resolvingFunctions.[[Resolve]], resolvingFunctions.[[Reject]] >>).
        try
        {
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(),
                        executor, CallInfo(CallFlags_Value, 3),
                        library->GetUndefined(),
                        resolve,
                        reject);
            }
            END_SAFE_REENTRANT_CALL
        }
        catch (const JavascriptException& err)
        {
            exception = err.GetAndClear();
        }

        if (exception != nullptr)
        {
            // 10. If completion is an abrupt completion, then
            //    a. Perform ? Call(resolvingFunctions.[[Reject]], undefined, << completion.[[Value]] >>).
            TryRejectWithExceptionObject(exception, reject, scriptContext);
        }

        // 11. Return promise.
        return promise;
    }